

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rga.cpp
# Opt level: O2

MPP_RET rga_deinit(RgaCtx ctx)

{
  MPP_RET MVar1;
  
  if (ctx == (RgaCtx)0x0) {
    _mpp_log_l(2,0,"invalid input","rga_deinit");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    if (-1 < *ctx) {
      close(*ctx);
      *(undefined4 *)ctx = 0xffffffff;
    }
    mpp_osal_free("rga_deinit",ctx);
    MVar1 = MPP_OK;
  }
  return MVar1;
}

Assistant:

MPP_RET rga_deinit(RgaCtx ctx)
{
    MPP_RET ret = MPP_OK;
    RgaCtxImpl *impl = NULL;

    rga_dbg_func("in\n");

    impl = (RgaCtxImpl *)ctx;
    if (!impl) {
        mpp_err_f("invalid input");
        ret = MPP_ERR_NULL_PTR;
        goto END;
    }

    if (impl->rga_fd >= 0) {
        close(impl->rga_fd);
        impl->rga_fd = -1;
    }

    mpp_free(impl);
END:
    rga_dbg_func("out\n");
    return ret;
}